

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

ostream * lambda::operator<<(ostream *os,Parse_ast *ast)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  anon_class_8_1_3fcf66a2 local_38;
  anon_class_8_1_3fcf66a2 local_30;
  anon_class_8_1_3fcf66a2 local_28;
  ublib local_20 [8];
  Parse_ast *local_18;
  Parse_ast *ast_local;
  ostream *os_local;
  
  local_18 = ast;
  ast_local = (Parse_ast *)os;
  ublib::match<lambda::Parse_ast_const&>(local_20,ast);
  local_28.os = (ostream *)ast_local;
  local_30.os = (ostream *)ast_local;
  local_38.os = (ostream *)ast_local;
  pbVar1 = ublib::impl::Matcher<lambda::Parse_ast_const&>::operator<<
                     ((Matcher<lambda::Parse_ast_const&> *)local_20,&local_28,&local_30,&local_38);
  return pbVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Parse_ast const& ast) noexcept {
  return match(ast)(
      [&](Parse_ast::Variable const& v) -> std::ostream& { return os << v.name(); },
      [&](Parse_ast::Call const& v) -> std::ostream& {
        return os << v.callee() << ' ' << v.argument();
      },
      [&](Parse_ast::Lambda const& v) -> std::ostream& {
        return os << '(' << '/' << v.parameter() << '.' << v.expression()
                  << ')';
      });
}